

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::send_reconnect_request(raft_server *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  element_type *peVar6;
  long in_RDI;
  rpc_handler *in_stack_00000038;
  ptr<req_msg> *in_stack_00000040;
  ptr<peer> *in_stack_00000048;
  peer *in_stack_00000050;
  ptr<req_msg> req;
  ptr<peer> p_leader;
  iterator entry;
  unique_lock<std::recursive_mutex> guard;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffe88;
  shared_ptr<nuraft::peer> *psVar7;
  peer *in_stack_fffffffffffffe90;
  __atomic_base<int> *in_stack_fffffffffffffe98;
  atomic<int> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  msg_type *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  string local_f0 [32];
  string local_d0 [48];
  undefined1 local_a0 [72];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_58 [2];
  string local_48 [72];
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffe90,
             (mutex_type *)in_stack_fffffffffffffe88);
  _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffffe98);
  if (_Var2 == *(int *)(in_RDI + 0x38)) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2af3c6);
      iVar3 = (*peVar5->_vptr_logger[7])();
      if (1 < iVar3) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af3f9);
        msg_if_given_abi_cxx11_
                  ((char *)local_48,"this node %d is leader, cannot send reconnect request",
                   (ulong)*(uint *)(in_RDI + 0x38));
        (*peVar5->_vptr_logger[8])
                  (peVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"send_reconnect_request",0x382,local_48);
        std::__cxx11::string::~string(local_48);
      }
    }
    local_58[1]._M_cur._4_4_ = 1;
  }
  else {
    local_a0._68_4_ = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffffe98);
    local_58[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find(in_stack_fffffffffffffe88,(key_type *)0x2af4eb);
    local_a0._56_8_ =
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end(in_stack_fffffffffffffe88);
    bVar1 = std::__detail::operator!=
                      (local_58,(_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                 *)(local_a0 + 0x38));
    if (bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x2af546);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffe90,
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2af56e);
      local_a0._16_8_ = srv_state::get_term((srv_state *)0x2af576);
      local_a0._12_4_ = 0x1a;
      local_a0._8_4_ = 0;
      local_a0._4_4_ = 0;
      local_a0._0_4_ = 0;
      in_stack_fffffffffffffe90 = (peer *)local_a0;
      psVar7 = (shared_ptr<nuraft::peer> *)(local_a0 + 4);
      cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&,int,int,int>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0,
                 (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->_M_i,
                 in_stack_fffffffffffffed0,
                 (int *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2af617);
      bVar1 = peer::make_busy(in_stack_fffffffffffffe90);
      if (bVar1) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2af644);
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffe90,psVar7);
        peer::send_req(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2af695);
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af723);
          iVar3 = (*peVar5->_vptr_logger[7])();
          if (1 < iVar3) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2af756);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2af768);
            uVar4 = peer::get_id((peer *)0x2af770);
            msg_if_given_abi_cxx11_
                      ((char *)local_d0,"previous message to leader %d hasn\'t been responded yet",
                       (ulong)uVar4);
            (*peVar5->_vptr_logger[8])
                      (peVar5,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"send_reconnect_request",0x394,local_d0);
            std::__cxx11::string::~string(local_d0);
          }
        }
      }
      std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x2af804);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2af811);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af866);
        iVar3 = (*peVar5->_vptr_logger[7])();
        if (0 < iVar3) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af899);
          msg_if_given_abi_cxx11_((char *)local_f0,"cannot find leader!");
          (*peVar5->_vptr_logger[8])
                    (peVar5,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"send_reconnect_request",0x399,local_f0);
          std::__cxx11::string::~string(local_f0);
        }
      }
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2af92d);
      peVar6 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af935);
      (*peVar6->_vptr_state_mgr[8])(peVar6,0xffffffea);
    }
    local_58[1]._M_cur._4_4_ = 0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void raft_server::send_reconnect_request() {
    recur_lock(lock_);

    if (leader_ == id_) {
        p_er("this node %d is leader, "
             "cannot send reconnect request",
             id_);
        return;
    }

    // Find leader object.
    auto entry = peers_.find(leader_);
    if (entry != peers_.end()) {
        ptr<peer> p_leader = entry->second;
        ptr<req_msg> req = cs_new<req_msg>( state_->get_term(),
                                            msg_type::reconnect_request,
                                            id_,
                                            leader_,
                                            0, 0, 0 );

        if (p_leader->make_busy()) {
            p_leader->send_req(p_leader, req, ex_resp_handler_);
        } else {
            p_er("previous message to leader %d hasn't been responded yet",
                 p_leader->get_id());
        }

    } else {
        // LCOV_EXCL_START
        p_ft("cannot find leader!");
        ctx_->state_mgr_->system_exit(N22_unrecoverable_isolation);
        // LCOV_EXCL_STOP
    }
}